

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * coda_strnstr(char *s,char *n,size_t len)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  if ((s != (char *)0x0) && (*s != '\0')) {
    if (n == (char *)0x0) {
      return s;
    }
    cVar1 = *n;
    if (cVar1 == '\0') {
      return s;
    }
    sVar2 = strlen(n);
    if ((sVar2 <= len) && (0 < (long)len)) {
      pcVar6 = s + len;
      pcVar3 = s + 1;
      do {
        if (*s == cVar1) {
          pcVar4 = n;
          pcVar5 = pcVar3;
          if (s < pcVar6 && 0 < (long)sVar2) {
            do {
              if ((pcVar5[-1] != *pcVar4) || (pcVar4 = pcVar4 + 1, pcVar6 <= pcVar5)) break;
              pcVar5 = pcVar5 + 1;
            } while (pcVar4 < n + sVar2);
          }
          if (pcVar4 == n + sVar2) {
            return s;
          }
        }
        s = s + 1;
        pcVar3 = pcVar3 + 1;
      } while (s < pcVar6);
    }
  }
  return (char *)0x0;
}

Assistant:

char *coda_strnstr(const char *s, const char *n, size_t len)
{
	size_t nsz;
	const char *es, *en;
	const char *w;
	const char *x;

	if (!s || !*s) return NULL;
	if (!n || !*n) return (char *) s;

	if (len < (nsz = strlen(n))) return NULL;

	es = s + len;
	en = n + nsz;

	for (; s < es; ++s)
	{
		if (*s == *n)
		{
			for (w = s, x = n; w < es && x < en; ++w, ++x)
			{
				if (*w != *x) break;
			}

			if (x == en) return (char *) s;
		}
	}

	return NULL;
}